

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool test4(void)

{
  int *piVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  vector<int> local_78;
  vector<int> v2;
  vector<int> local_48;
  vector<int> w2;
  
  local_48.mData = (int *)operator_new__(0x28);
  local_48.mData[0] = 0;
  local_48.mData[1] = 0;
  local_48.mData[2] = 0;
  local_48.mData[3] = 0;
  local_48.mData[4] = 0;
  local_48.mData[5] = 0;
  local_48.mData[6] = 0;
  local_48.mData[7] = 0;
  local_48.mData[8] = 0;
  local_48.mData[9] = 0;
  local_48.mCap = 10;
  local_48.mSize = 10;
  local_78.mData = (int *)operator_new__(0xc);
  local_78.mData[2] = 0;
  local_78.mData[0] = 0;
  local_78.mData[1] = 0;
  local_78.mCap = 3;
  local_78.mSize = 3;
  for (v2.mData._0_4_ = 0; (int)v2.mData < 500000; v2.mData._0_4_ = (int)v2.mData + 1) {
    CP::vector<int>::push_back(&local_48,(int *)&v2);
  }
  for (iVar6 = 0; iVar6 != -400000; iVar6 = iVar6 + -2) {
    v2.mData._0_4_ = iVar6;
    CP::vector<int>::push_back(&local_78,(int *)&v2);
  }
  CP::vector<int>::vector(&v2,&local_48);
  CP::vector<int>::vector(&w2,&local_78);
  sVar3 = local_48.mSize;
  sVar2 = local_48.mCap;
  piVar1 = local_48.mData;
  local_48.mData = local_78.mData;
  local_78.mData = piVar1;
  local_48.mCap = local_78.mCap;
  local_48.mSize = local_78.mSize;
  local_78.mCap = sVar2;
  local_78.mSize = sVar3;
  bVar4 = CP::vector<int>::operator==(&local_48,&w2);
  if (bVar4) {
    bVar4 = CP::vector<int>::operator==(&local_78,&v2);
    bVar5 = true;
    if (bVar4) goto LAB_001016f4;
  }
  bVar5 = false;
LAB_001016f4:
  CP::vector<int>::~vector(&w2);
  CP::vector<int>::~vector(&v2);
  CP::vector<int>::~vector(&local_78);
  CP::vector<int>::~vector(&local_48);
  return bVar5;
}

Assistant:

bool test4() {
  CP::vector<int> v(10);
  CP::vector<int> w(3);
  int n1 = 500000;
  int n2 = 200000;
  for (int i = 0;i < n1;i++) v.push_back(i);
  for (int i = 0;i < n2;i++) w.push_back(-i*2);

  CP::vector<int> v2(v);
  CP::vector<int> w2(w);
  v.swap(w);
  if (v == w2 && w == v2) return true;
  return false;
}